

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QKeySequenceRevealerFilter.cpp
# Opt level: O2

bool __thiscall
QKeySequenceRevealerFilter::eventFilter
          (QKeySequenceRevealerFilter *this,QObject *object,QEvent *event)

{
  char cVar1;
  undefined1 uVar2;
  QToolButton *pQVar3;
  long lVar4;
  QPushButton *pQVar5;
  QLabel *pQVar6;
  QKeySequence sequence;
  QKeySequence local_120 [16];
  QKeySequence shortcut;
  undefined1 local_f8 [8];
  undefined1 auStack_f0 [8];
  bool local_e8;
  undefined7 uStack_e7;
  optional<std::pair<QWidget_*,_QKeySequence>_> ws;
  QArrayDataPointer<char16_t> local_b8;
  optional<std::pair<QWidget_*,_QString>_> widgetToolTip;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  
  if ((*(ushort *)(event + 8) & 0xfffe) != 0x6e) goto LAB_001a436a;
  ws.super__Optional_base<std::pair<QWidget_*,_QKeySequence>,_false,_false>._M_payload.
  super__Optional_payload<std::pair<QWidget_*,_QKeySequence>,_true,_false,_false>.
  super__Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_>._M_engaged = false;
  pQVar3 = qobject_cast<QToolButton*>(object);
  if (pQVar3 == (QToolButton *)0x0) {
LAB_001a3f89:
    local_e8 = false;
  }
  else {
    QAbstractButton::shortcut();
    cVar1 = QKeySequence::isEmpty();
    if (cVar1 != '\0') {
      QKeySequence::~QKeySequence(&shortcut);
      lVar4 = QToolButton::defaultAction();
      if (lVar4 != 0) {
        QAction::shortcut();
        cVar1 = QKeySequence::isEmpty();
        QKeySequence::~QKeySequence(&sequence);
        if (cVar1 == '\0') {
          QAction::shortcut();
          _sequence = pQVar3;
          QKeySequence::QKeySequence(local_120,&shortcut);
          std::_Optional_payload_base<std::pair<QWidget*,QKeySequence>>::
          _Optional_payload_base<std::pair<QWidget*,QKeySequence>>
                    ((_Optional_payload_base<std::pair<QWidget*,QKeySequence>> *)local_f8,&sequence)
          ;
          goto LAB_001a4022;
        }
      }
      lVar4 = QToolButton::menu();
      if (lVar4 != 0) {
        QMenu::menuAction();
        QAction::shortcut();
        cVar1 = QKeySequence::isEmpty();
        QKeySequence::~QKeySequence(&sequence);
        if (cVar1 == '\0') {
          QMenu::menuAction();
          QAction::shortcut();
          _sequence = pQVar3;
          QKeySequence::QKeySequence(local_120,&shortcut);
          std::_Optional_payload_base<std::pair<QWidget*,QKeySequence>>::
          _Optional_payload_base<std::pair<QWidget*,QKeySequence>>
                    ((_Optional_payload_base<std::pair<QWidget*,QKeySequence>> *)local_f8,&sequence)
          ;
          goto LAB_001a4022;
        }
      }
      goto LAB_001a3f89;
    }
    _sequence = pQVar3;
    QKeySequence::QKeySequence(local_120,&shortcut);
    std::_Optional_payload_base<std::pair<QWidget*,QKeySequence>>::
    _Optional_payload_base<std::pair<QWidget*,QKeySequence>>
              ((_Optional_payload_base<std::pair<QWidget*,QKeySequence>> *)local_f8,&sequence);
LAB_001a4022:
    QKeySequence::~QKeySequence(local_120);
    QKeySequence::~QKeySequence(&shortcut);
  }
  std::_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_>::_M_move_assign
            ((_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_> *)&ws,
             (_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_> *)local_f8);
  std::_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_>::_M_reset
            ((_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_> *)local_f8);
  if (ws.super__Optional_base<std::pair<QWidget_*,_QKeySequence>,_false,_false>._M_payload.
      super__Optional_payload<std::pair<QWidget_*,_QKeySequence>,_true,_false,_false>.
      super__Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_>._M_engaged == false) {
    pQVar5 = qobject_cast<QPushButton*>(object);
    if (pQVar5 == (QPushButton *)0x0) {
LAB_001a40c8:
      local_e8 = false;
    }
    else {
      QAbstractButton::shortcut();
      cVar1 = QKeySequence::isEmpty();
      if (cVar1 != '\0') {
        QKeySequence::~QKeySequence(&shortcut);
        lVar4 = QPushButton::menu();
        if (lVar4 != 0) {
          QMenu::menuAction();
          QAction::shortcut();
          cVar1 = QKeySequence::isEmpty();
          QKeySequence::~QKeySequence(&sequence);
          if (cVar1 == '\0') {
            QMenu::menuAction();
            QAction::shortcut();
            _sequence = (QToolButton *)pQVar5;
            QKeySequence::QKeySequence(local_120,&shortcut);
            std::_Optional_payload_base<std::pair<QWidget*,QKeySequence>>::
            _Optional_payload_base<std::pair<QWidget*,QKeySequence>>
                      ((_Optional_payload_base<std::pair<QWidget*,QKeySequence>> *)local_f8,
                       &sequence);
            goto LAB_001a412c;
          }
        }
        goto LAB_001a40c8;
      }
      _sequence = (QToolButton *)pQVar5;
      QKeySequence::QKeySequence(local_120,&shortcut);
      std::_Optional_payload_base<std::pair<QWidget*,QKeySequence>>::
      _Optional_payload_base<std::pair<QWidget*,QKeySequence>>
                ((_Optional_payload_base<std::pair<QWidget*,QKeySequence>> *)local_f8,&sequence);
LAB_001a412c:
      QKeySequence::~QKeySequence(local_120);
      QKeySequence::~QKeySequence(&shortcut);
    }
    std::_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_>::_M_move_assign
              ((_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_> *)&ws,
               (_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_> *)local_f8);
    std::_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_>::_M_reset
              ((_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_> *)local_f8);
  }
  if (((ws.super__Optional_base<std::pair<QWidget_*,_QKeySequence>,_false,_false>._M_payload.
        super__Optional_payload<std::pair<QWidget_*,_QKeySequence>,_true,_false,_false>.
        super__Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_>._M_engaged & 1U) == 0) &&
     (pQVar6 = qobject_cast<QLabel*>(object), pQVar6 != (QLabel *)0x0)) {
    QLabel::text();
    lVar4 = CONCAT71(uStack_e7,local_e8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
    if (lVar4 != 0) {
      QLabel::text();
      QKeySequence::mnemonic((QString *)&sequence);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_f8);
      cVar1 = QKeySequence::isEmpty();
      if (cVar1 == '\0') {
        local_f8 = (undefined1  [8])pQVar6;
        QKeySequence::QKeySequence((QKeySequence *)auStack_f0,&sequence);
        std::optional<std::pair<QWidget*,QKeySequence>>::operator=
                  ((optional<std::pair<QWidget*,QKeySequence>> *)&ws,
                   (pair<QWidget_*,_QKeySequence> *)local_f8);
        QKeySequence::~QKeySequence((QKeySequence *)auStack_f0);
      }
      QKeySequence::~QKeySequence(&sequence);
    }
  }
  if (ws.super__Optional_base<std::pair<QWidget_*,_QKeySequence>,_false,_false>._M_payload.
      super__Optional_payload<std::pair<QWidget_*,_QKeySequence>,_true,_false,_false>.
      super__Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_>._M_engaged == true) {
    local_b8.d = (Data *)0x0;
    local_b8.ptr = L"%1 (%2)";
    local_b8.size = 7;
    local_78.d = (Data *)0x0;
    local_78.ptr = (char16_t *)0x0;
    local_78.size = 0;
    QWidget::toolTip();
    QKeySequence::toString
              (&local_60,
               (undefined1 *)
               ((long)&ws.super__Optional_base<std::pair<QWidget_*,_QKeySequence>,_false,_false>.
                       _M_payload.
                       super__Optional_payload<std::pair<QWidget_*,_QKeySequence>,_true,_false,_false>
                       .super__Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_>._M_payload
               + 8),1);
    QString::arg<QString,QString>
              ((type *)&shortcut,(QString *)&local_b8,(QString *)&local_48,(QString *)&local_60);
    QString::trimmed_helper((QString *)&sequence);
    local_f8 = (undefined1  [8])
               ws.super__Optional_base<std::pair<QWidget_*,_QKeySequence>,_false,_false>._M_payload.
               super__Optional_payload<std::pair<QWidget_*,_QKeySequence>,_true,_false,_false>.
               super__Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_>._M_payload._M_value
               .first;
    QString::QString((QString *)auStack_f0,(QString *)&sequence);
    std::optional<std::pair<QWidget_*,_QString>_>::optional<std::pair<QWidget_*,_QString>,_true>
              (&widgetToolTip,(pair<QWidget_*,_QString> *)local_f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&sequence);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&shortcut);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  else {
    widgetToolTip.super__Optional_base<std::pair<QWidget_*,_QString>,_false,_false>._M_payload.
    super__Optional_payload<std::pair<QWidget_*,_QString>,_true,_false,_false>.
    super__Optional_payload_base<std::pair<QWidget_*,_QString>_>._M_engaged = false;
  }
  std::_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_>::_M_reset
            ((_Optional_payload_base<std::pair<QWidget_*,_QKeySequence>_> *)&ws);
  if (widgetToolTip.super__Optional_base<std::pair<QWidget_*,_QString>,_false,_false>._M_payload.
      super__Optional_payload<std::pair<QWidget_*,_QString>,_true,_false,_false>.
      super__Optional_payload_base<std::pair<QWidget_*,_QString>_>._M_engaged == true) {
    if (*(short *)(event + 8) == 0x6f) {
      QWhatsThis::showText
                ((QPoint *)(event + 0x18),
                 (QString *)
                 ((long)&widgetToolTip.
                         super__Optional_base<std::pair<QWidget_*,_QString>,_false,_false>.
                         _M_payload.
                         super__Optional_payload<std::pair<QWidget_*,_QString>,_true,_false,_false>.
                         super__Optional_payload_base<std::pair<QWidget_*,_QString>_>._M_payload + 8
                 ),widgetToolTip.super__Optional_base<std::pair<QWidget_*,_QString>,_false,_false>.
                   _M_payload.
                   super__Optional_payload<std::pair<QWidget_*,_QString>,_true,_false,_false>.
                   super__Optional_payload_base<std::pair<QWidget_*,_QString>_>._M_payload._M_value.
                   first);
    }
    else if (*(short *)(event + 8) == 0x6e) {
      local_f8 = (undefined1  [8])0x0;
      auStack_f0 = (undefined1  [8])0xffffffffffffffff;
      QToolTip::showText((QPoint *)(event + 0x18),
                         (QString *)
                         ((long)&widgetToolTip.
                                 super__Optional_base<std::pair<QWidget_*,_QString>,_false,_false>.
                                 _M_payload.
                                 super__Optional_payload<std::pair<QWidget_*,_QString>,_true,_false,_false>
                                 .super__Optional_payload_base<std::pair<QWidget_*,_QString>_>.
                                 _M_payload + 8),
                         widgetToolTip.
                         super__Optional_base<std::pair<QWidget_*,_QString>,_false,_false>.
                         _M_payload.
                         super__Optional_payload<std::pair<QWidget_*,_QString>,_true,_false,_false>.
                         super__Optional_payload_base<std::pair<QWidget_*,_QString>_>._M_payload.
                         _M_value.first,(QRect *)local_f8,-1);
    }
    std::_Optional_payload_base<std::pair<QWidget_*,_QString>_>::_M_reset
              ((_Optional_payload_base<std::pair<QWidget_*,_QString>_> *)&widgetToolTip);
    return true;
  }
  std::_Optional_payload_base<std::pair<QWidget_*,_QString>_>::_M_reset
            ((_Optional_payload_base<std::pair<QWidget_*,_QString>_> *)&widgetToolTip);
LAB_001a436a:
  uVar2 = QObject::eventFilter(&this->super_QObject,(QEvent *)object);
  return (bool)uVar2;
}

Assistant:

bool QKeySequenceRevealerFilter::eventFilter(QObject *object, QEvent *event) {
    switch (event->type()) {
    case QEvent::ToolTip:
    case QEvent::WhatsThis: {
        const auto widgetToolTip = [&]() -> std::optional<WidgetToolTip> {
            std::optional<WidgetSequence> ws;

            if (!ws) {
                ws = buttonEffectiveShortcut(qobject_cast<QToolButton *>(object));
            }

            if (!ws) {
                ws = buttonEffectiveShortcut(qobject_cast<QPushButton *>(object));
            }

            if (!ws) {
                if (auto label = qobject_cast<QLabel *>(object); label && !label->text().isEmpty()) {
                    const auto sequence = QKeySequence::mnemonic(label->text());

                    if (!sequence.isEmpty()) {
                        ws = {label, sequence};
                    }
                }
            }

            return ws
                ? WidgetToolTip {ws->first, QSL("%1 (%2)").arg(ws->first->toolTip(), ws->second.toString()).trimmed()}
                : std::optional<WidgetToolTip> {};
        }();

        if (widgetToolTip) {
            if (event->type() == QEvent::ToolTip) {
                const auto he = static_cast<QHelpEvent *>(event);
                QToolTip::showText(he->globalPos(), widgetToolTip->second, widgetToolTip->first);
            } else if (event->type() == QEvent::WhatsThis) {
                const auto he = static_cast<QHelpEvent *>(event);
                QWhatsThis::showText(he->globalPos(), widgetToolTip->second, widgetToolTip->first);
            }

            return true;
        }

        break;
    }
    default:
        break;
    }

    return QObject::eventFilter(object, event);
}